

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O2

EntryPtr __thiscall
cursespp::SimpleScrollAdapter::GetEntry
          (SimpleScrollAdapter *this,ScrollableWindow *window,size_t index)

{
  SingleLineEntry *this_00;
  __shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  iterator __position;
  mapped_type *pmVar2;
  size_type in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  WINDOW **ppWVar4;
  undefined1 auVar5 [16];
  EntryPtr EVar6;
  size_type local_58;
  _Rb_tree<unsigned_long,std::pair<unsigned_long_const,cursespp::Color>,std::_Select1st<std::pair<unsigned_long_const,cursespp::Color>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cursespp::Color>>>
  *local_50;
  mapped_type local_48;
  Color local_40;
  Color local_38;
  
  local_58 = in_RCX;
  p_Var1 = &std::
            deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
            ::at((deque<std::shared_ptr<cursespp::IScrollAdapter::IEntry>,_std::allocator<std::shared_ptr<cursespp::IScrollAdapter::IEntry>_>_>
                  *)&(window->super_Window).contentColor,in_RCX)->
            super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2> *)this,
             p_Var1);
  _Var3._M_pi = extraout_RDX;
  if ((index != 0) && ((window->super_Window).lastNotifiedVisible == true)) {
    this_00 = (SingleLineEntry *)
              (this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter;
    local_50 = (_Rb_tree<unsigned_long,std::pair<unsigned_long_const,cursespp::Color>,std::_Select1st<std::pair<unsigned_long_const,cursespp::Color>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cursespp::Color>>>
                *)&(window->super_Window).framePanel;
    __position = std::
                 _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cursespp::Color>,_std::_Select1st<std::pair<const_unsigned_long,_cursespp::Color>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                 ::find((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_cursespp::Color>,_std::_Select1st<std::pair<const_unsigned_long,_cursespp::Color>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                         *)local_50,&local_58);
    auVar5 = (**(code **)(*(long *)index + 0x208))(index);
    _Var3._M_pi = auVar5._8_8_;
    ppWVar4 = &(window->super_Window).frame;
    if (local_58 == *(size_type *)(auVar5._0_8_ + 0x20)) {
      if (__position._M_node == (_Base_ptr)ppWVar4) {
        (*(this_00->super_IEntry)._vptr_IEntry[5])(&local_48,this_00,0);
        pmVar2 = std::
                 map<unsigned_long,_cursespp::Color,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                 ::operator[]((map<unsigned_long,_cursespp::Color,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_cursespp::Color>_>_>
                               *)local_50,&local_58);
        pmVar2->value = local_48.value;
      }
      local_38.value = 0x200;
      SingleLineEntry::SetAttrs(this_00,&local_38);
      _Var3._M_pi = extraout_RDX_00;
    }
    else if (__position._M_node != (_Base_ptr)ppWVar4) {
      local_40.value = (int64_t)__position._M_node[1]._M_parent;
      SingleLineEntry::SetAttrs(this_00,&local_40);
      std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,cursespp::Color>,std::_Select1st<std::pair<unsigned_long_const,cursespp::Color>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,cursespp::Color>>>
      ::erase_abi_cxx11_(local_50,__position);
      _Var3._M_pi = extraout_RDX_01;
    }
  }
  EVar6.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var3._M_pi;
  EVar6.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (EntryPtr)
         EVar6.super___shared_ptr<cursespp::IScrollAdapter::IEntry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

EntryPtr SimpleScrollAdapter::GetEntry(cursespp::ScrollableWindow* window, size_t index) {
    auto entry = this->entries.at(index);

    /* this is pretty damned gross, but super convenient; we always use SingleLineEntry
    internally, so we can do a static_cast<>. we allow the user to customize the
    color of the line when it's de-selected, so when it becomes selected we remember
    the original color. upon de-select, the color is restored (see indexToColor) */
    if (window && selectable) {
        SingleLineEntry* single = static_cast<SingleLineEntry*>(entry.get());
        auto it = indexToColor.find(index);
        if (index == window->GetScrollPosition().logicalIndex) {
            if (it == indexToColor.end()) {
                indexToColor[index] = single->GetAttrs(0);
            }
            single->SetAttrs(Color(Color::ListItemHighlighted));
        }
        else {
            if (it != indexToColor.end()) {
                single->SetAttrs(it->second);
                indexToColor.erase(it);
            }
        }
    }

    return entry;
}